

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O0

void * mpp_dec_parser_thread(void *data)

{
  MppDecImpl *dec_00;
  MppThread *this;
  MppThreadStatus MVar1;
  MPP_RET MVar2;
  Mutex *pMVar3;
  undefined1 local_120 [8];
  AutoMutex autolock_1;
  undefined1 local_108 [8];
  AutoMutex autolock;
  HalDecTask *task_dec;
  DecTask task;
  MppBufSlots packet_slots;
  MppThread *parser;
  MppDecImpl *dec;
  Mpp *mpp;
  void *data_local;
  
  dec_00 = *(MppDecImpl **)((long)data + 0xa8);
  this = dec_00->thread_parser;
  task.hal_frm_buf_out = dec_00->packet_slots;
  autolock.mLock = (Mutex *)&task.status;
  dec_task_init((DecTask *)&task_dec);
  mpp_clock_start(dec_00->clocks[0]);
  while( true ) {
    pMVar3 = MppThread::mutex(this,THREAD_WORK);
    Mutex::Autolock::Autolock((Autolock *)local_108,pMVar3,1);
    MVar1 = MppThread::get_status(this,THREAD_WORK);
    if (MVar1 == MPP_THREAD_RUNNING) {
      MVar2 = check_task_wait(dec_00,(DecTask *)&task_dec);
      if (MVar2 != MPP_OK) {
        mpp_clock_start(dec_00->clocks[1]);
        MppThread::wait(this,(void *)0x0);
        mpp_clock_pause(dec_00->clocks[1]);
      }
      autolock_1.mLock._4_4_ = 0;
    }
    else {
      autolock_1.mLock._4_4_ = 3;
    }
    Mutex::Autolock::~Autolock((Autolock *)local_108);
    if (autolock_1.mLock._4_4_ != 0) break;
    if (dec_00->cmd_send == dec_00->cmd_recv) {
      if (dec_00->reset_flag == 0) {
        mpp_clock_start(dec_00->clocks[2]);
        try_proc_dec_task((Mpp *)data,(DecTask *)&task_dec);
        mpp_clock_pause(dec_00->clocks[2]);
      }
      else {
        reset_parser_thread((Mpp *)data,(DecTask *)&task_dec);
        pMVar3 = MppThread::mutex(this,THREAD_CONTROL);
        Mutex::Autolock::Autolock((Autolock *)local_120,pMVar3,1);
        dec_00->reset_flag = 0;
        sem_post((sem_t *)&dec_00->parser_reset);
        autolock_1.mLock._4_4_ = 2;
        Mutex::Autolock::~Autolock((Autolock *)local_120);
      }
    }
    else {
      if ((mpp_dec_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_dec","ctrl proc %d cmd %08x\n","mpp_dec_parser_thread",
                   (ulong)dec_00->cmd_recv,(ulong)dec_00->cmd);
      }
      sem_wait((sem_t *)&dec_00->cmd_start);
      MVar2 = mpp_dec_proc_cfg(dec_00,dec_00->cmd,dec_00->param);
      *dec_00->cmd_ret = MVar2;
      dec_00->cmd_recv = dec_00->cmd_recv + 1;
      if ((mpp_dec_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_dec","ctrl proc %d done send %d\n","mpp_dec_parser_thread",
                   (ulong)dec_00->cmd_recv,(ulong)dec_00->cmd_send);
      }
      if ((dec_00->cmd_send != dec_00->cmd_send) &&
         (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "dec->cmd_send == dec->cmd_send","mpp_dec_parser_thread",0x2e2),
         (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      dec_00->param = (void *)0x0;
      dec_00->cmd = 0;
      dec_00->cmd_ret = (MPP_RET *)0x0;
      sem_post((sem_t *)&dec_00->cmd_done);
    }
  }
  mpp_clock_pause(dec_00->clocks[0]);
  if ((mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec","mpp_dec_parser_thread is going to exit\n",(char *)0x0);
  }
  if ((task_dec != (HalDecTask *)0x0) && (((autolock.mLock)->mMutex).__data.__lock != 0)) {
    mpp_buf_slot_set_flag
              (task.hal_frm_buf_out,autolock.mLock[1].mMutex.__data.__count,SLOT_CODEC_READY);
    mpp_buf_slot_set_flag
              (task.hal_frm_buf_out,autolock.mLock[1].mMutex.__data.__count,SLOT_HAL_INPUT);
    mpp_buf_slot_clr_flag
              (task.hal_frm_buf_out,autolock.mLock[1].mMutex.__data.__count,SLOT_HAL_INPUT);
  }
  mpp_buffer_group_clear(*(MppBufferGroup *)((long)data + 0x38));
  dec_release_task_in_port(*(MppPort *)((long)data + 0x60));
  if ((mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec","mpp_dec_parser_thread exited\n",(char *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *mpp_dec_parser_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppThread *parser = dec->thread_parser;
    MppBufSlots packet_slots = dec->packet_slots;

    DecTask task;
    HalDecTask  *task_dec = &task.info.dec;

    dec_task_init(&task);

    mpp_clock_start(dec->clocks[DEC_PRS_TOTAL]);

    while (1) {
        {
            AutoMutex autolock(parser->mutex());
            if (MPP_THREAD_RUNNING != parser->get_status())
                break;

            /*
             * parser thread need to wait at cases below:
             * 1. no task slot for output
             * 2. no packet for parsing
             * 3. info change on progress
             * 3. no buffer on analyzing output task
             */
            if (check_task_wait(dec, &task)) {
                mpp_clock_start(dec->clocks[DEC_PRS_WAIT]);
                parser->wait();
                mpp_clock_pause(dec->clocks[DEC_PRS_WAIT]);
            }
        }

        // process user control
        if (dec->cmd_send != dec->cmd_recv) {
            dec_dbg_detail("ctrl proc %d cmd %08x\n", dec->cmd_recv, dec->cmd);
            sem_wait(&dec->cmd_start);
            *dec->cmd_ret = mpp_dec_proc_cfg(dec, dec->cmd, dec->param);
            dec->cmd_recv++;
            dec_dbg_detail("ctrl proc %d done send %d\n", dec->cmd_recv,
                           dec->cmd_send);
            mpp_assert(dec->cmd_send == dec->cmd_send);
            dec->param = NULL;
            dec->cmd = (MpiCmd)0;
            dec->cmd_ret = NULL;
            sem_post(&dec->cmd_done);
            continue;
        }

        if (dec->reset_flag) {
            reset_parser_thread(mpp, &task);

            AutoMutex autolock(parser->mutex(THREAD_CONTROL));
            dec->reset_flag = 0;
            sem_post(&dec->parser_reset);
            continue;
        }

        // NOTE: ignore return value here is to fast response to reset.
        // Otherwise we can loop all dec task until it is failed.
        mpp_clock_start(dec->clocks[DEC_PRS_PROC]);
        try_proc_dec_task(mpp, &task);
        mpp_clock_pause(dec->clocks[DEC_PRS_PROC]);
    }

    mpp_clock_pause(dec->clocks[DEC_PRS_TOTAL]);

    mpp_dbg_info("mpp_dec_parser_thread is going to exit\n");
    if (task.hnd && task_dec->valid) {
        mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_CODEC_READY);
        mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);
        mpp_buf_slot_clr_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);
    }
    mpp_buffer_group_clear(mpp->mPacketGroup);
    dec_release_task_in_port(mpp->mMppInPort);
    mpp_dbg_info("mpp_dec_parser_thread exited\n");
    return NULL;
}